

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void * __thiscall Js::FunctionProxy::GetAuxPtr(FunctionProxy *this,AuxPointerType e)

{
  code *pcVar1;
  bool bVar2;
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> **ppAVar3;
  ThreadContext *pTVar4;
  CCLock *this_00;
  undefined4 *puVar5;
  AuxPointerType e_local;
  FunctionProxy *this_local;
  
  ppAVar3 = Memory::WriteBarrierPtr::operator_cast_to_AuxPtrs__((WriteBarrierPtr *)&this->auxPtrs);
  if (*ppAVar3 == (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)0x0) {
    this_local = (FunctionProxy *)0x0;
  }
  else {
    pTVar4 = ThreadContext::GetContextForCurrentThread();
    if (pTVar4 == (ThreadContext *)0x0) {
      this_00 = &ThreadContext::GetCriticalSection()->super_CCLock;
      bVar2 = CCLock::IsLocked(this_00);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x70,
                                    "(ThreadContext::GetContextForCurrentThread() || ThreadContext::GetCriticalSection()->IsLocked())"
                                    ,
                                    "ThreadContext::GetContextForCurrentThread() || ThreadContext::GetCriticalSection()->IsLocked()"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
    this_local = (FunctionProxy *)
                 AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>::GetAuxPtr(this,e);
  }
  return this_local;
}

Assistant:

void* FunctionProxy::GetAuxPtr(AuxPointerType e) const
    {
        if (this->auxPtrs == nullptr)
        {
            return nullptr;
        }

        // On process detach this can be called from another thread but the ThreadContext should be locked
        Assert(ThreadContext::GetContextForCurrentThread() || ThreadContext::GetCriticalSection()->IsLocked());
        return AuxPtrsT::GetAuxPtr(this, e);
    }